

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> __thiscall
kj::anon_unknown_35::InMemoryDirectory::Impl::tryGetEntry(Impl *this,StringPtr name)

{
  _Base_ptr p_Var1;
  int iVar2;
  Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&> MVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr __n;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  
  p_Var5 = (_Base_ptr)name.content.size_;
  p_Var6 = &(this->entries)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var6->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0;
      p_Var4 = (&p_Var4->_M_left)[iVar2 < 0 || iVar2 == 0 && p_Var1 < p_Var5]) {
    p_Var1 = p_Var4[1]._M_parent;
    __n = p_Var5;
    if (p_Var1 < p_Var5) {
      __n = p_Var1;
    }
    iVar2 = memcmp(*(void **)(p_Var4 + 1),name.content.ptr,(size_t)__n);
    if (iVar2 >= 0 && (iVar2 != 0 || p_Var1 >= p_Var5)) {
      p_Var7 = p_Var4;
    }
  }
  p_Var4 = &p_Var6->_M_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var6) {
    p_Var1 = p_Var7[1]._M_parent;
    p_Var4 = p_Var1;
    if (p_Var5 < p_Var1) {
      p_Var4 = p_Var5;
    }
    iVar2 = memcmp(name.content.ptr,*(void **)(p_Var7 + 1),(size_t)p_Var4);
    p_Var4 = p_Var7;
    if (iVar2 == 0) {
      p_Var4 = &p_Var6->_M_header;
    }
    if (p_Var1 <= p_Var5) {
      p_Var4 = p_Var7;
    }
    if (iVar2 < 0) {
      p_Var4 = &p_Var6->_M_header;
    }
  }
  MVar3.ptr = (EntryImpl *)0x0;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    MVar3.ptr = (EntryImpl *)&p_Var4[1]._M_left;
  }
  return (Maybe<const_kj::(anonymous_namespace)::InMemoryDirectory::EntryImpl_&>)MVar3.ptr;
}

Assistant:

kj::Maybe<const EntryImpl&> tryGetEntry(kj::StringPtr name) const {
      auto iter = entries.find(name);
      if (iter == entries.end()) {
        return nullptr;
      } else {
        return iter->second;
      }
    }